

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpExtraHeaders.c
# Opt level: O0

int UpnpExtraHeaders_assign(UpnpExtraHeaders *p,UpnpExtraHeaders *q)

{
  int iVar1;
  UpnpListHead *q_00;
  UpnpString *pUVar2;
  char *s;
  bool bVar3;
  bool bVar4;
  undefined1 local_49;
  undefined4 local_1c;
  int ok;
  UpnpExtraHeaders *q_local;
  UpnpExtraHeaders *p_local;
  
  local_1c = 1;
  if (p != q) {
    q_00 = UpnpExtraHeaders_get_node(q);
    iVar1 = UpnpExtraHeaders_set_node(p,q_00);
    bVar3 = false;
    if (iVar1 != 0) {
      pUVar2 = UpnpExtraHeaders_get_name(q);
      iVar1 = UpnpExtraHeaders_set_name(p,pUVar2);
      bVar3 = iVar1 != 0;
    }
    bVar4 = false;
    if (bVar3) {
      pUVar2 = UpnpExtraHeaders_get_value(q);
      iVar1 = UpnpExtraHeaders_set_value(p,pUVar2);
      bVar4 = iVar1 != 0;
    }
    local_49 = false;
    if (bVar4) {
      s = UpnpExtraHeaders_get_resp(q);
      iVar1 = UpnpExtraHeaders_set_resp(p,s);
      local_49 = iVar1 != 0;
    }
    local_1c = (uint)local_49;
  }
  return local_1c;
}

Assistant:

int UpnpExtraHeaders_assign(UpnpExtraHeaders *p, const UpnpExtraHeaders *q)
{
	int ok = 1;

	if (p != q) {
		ok = ok &&
		     UpnpExtraHeaders_set_node(p, UpnpExtraHeaders_get_node(q));
		ok = ok &&
		     UpnpExtraHeaders_set_name(p, UpnpExtraHeaders_get_name(q));
		ok = ok && UpnpExtraHeaders_set_value(
				   p, UpnpExtraHeaders_get_value(q));
		ok = ok &&
		     UpnpExtraHeaders_set_resp(p, UpnpExtraHeaders_get_resp(q));
	}

	return ok;
}